

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_parse.c
# Opt level: O3

MPP_RET parse_prepare_avcC_data(H264dInputCtx_t *p_Inp,H264dCurCtx_t *p_Cur)

{
  h264d_curstrm_t *p_strm;
  RK_U8 *pRVar1;
  MppPacket pvVar2;
  RK_U8 *pRVar3;
  h264_dec_ctx_t *phVar4;
  RK_S64 RVar5;
  MPP_RET MVar6;
  uint *puVar7;
  ulong uVar8;
  ulong uVar9;
  char *fmt;
  uint uVar10;
  undefined8 uVar11;
  
  pvVar2 = p_Inp->in_pkt;
  (p_Cur->strm).nalu_buf = (RK_U8 *)0x0;
  p_Inp->task_valid = '\0';
  if (p_Inp->pkt_eos != 0) {
    p_Inp->task_eos = 1;
    if (p_Inp->in_length == 0) {
      return MPP_OK;
    }
    p_Inp->task_valid = '\x01';
    return MPP_OK;
  }
  uVar8 = (ulong)p_Inp->nal_size;
  if (p_Inp->nal_size == 0) {
    MVar6 = MPP_ERR_VALUE;
    if (((byte)h264d_debug & 4) == 0) goto LAB_0018c81e;
    fmt = "value error(%d).\n";
    uVar11 = 0x388;
  }
  else {
    p_strm = &p_Cur->strm;
    puVar7 = (uint *)(p_Inp->in_buf + (p_Cur->strm).nalu_offset);
    (p_Cur->strm).curdata = (RK_U8 *)puVar7;
    uVar9 = p_Inp->in_length;
    MVar6 = MPP_ERR_UNKNOW;
    do {
      if (uVar9 == 0) {
        if (p_Cur->p_Dec->is_new_frame != '\0') goto LAB_0018c766;
        goto LAB_0018c7b6;
      }
      if ((p_Cur->strm).startcode_found != '\0') {
        switch((uint)uVar8 & 0xff) {
        case 1:
          uVar10 = (uint)(byte)*puVar7;
          break;
        case 2:
          uVar10 = (uint)(ushort)((ushort)*puVar7 << 8 | (ushort)*puVar7 >> 8);
          break;
        case 3:
          uVar10 = (uint)*(byte *)((long)puVar7 + 1) << 8 |
                   (uint)*(byte *)((long)puVar7 + 2) | (uint)(byte)*puVar7 << 0x10;
          break;
        case 4:
          uVar10 = *puVar7;
          uVar10 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                   uVar10 << 0x18;
          break;
        default:
          goto switchD_0018c577_default;
        }
        (p_Cur->strm).nalu_len = uVar10;
        if ((uVar10 == 0) || (uVar9 <= uVar10)) {
switchD_0018c577_default:
          phVar4 = p_Cur->p_Dec;
          phVar4->have_slice_data = '\0';
          phVar4->is_new_frame = '\x01';
          *(undefined8 *)((long)pvVar2 + 0x20) = 0;
          p_Inp->in_length = 0;
          (p_Cur->strm).nalu_len = 0;
          (p_Cur->strm).nalu_offset = 0;
          (p_Cur->strm).startcode_found = '\x01';
          (p_Cur->strm).endcode_found = '\0';
          (p_Cur->strm).nalu_buf = (RK_U8 *)0x0;
          goto LAB_0018c81e;
        }
        (p_Cur->strm).nalu_buf = (byte *)((long)puVar7 + uVar8);
        judge_is_new_frame(p_Cur,p_strm);
        phVar4 = p_Cur->p_Dec;
        if (phVar4->is_new_frame != '\0') {
          phVar4->have_slice_data = '\0';
          (p_Cur->strm).startcode_found = '\x01';
          (p_Cur->strm).endcode_found = '\0';
          goto LAB_0018c766;
        }
        uVar10 = p_Inp->nal_size;
        uVar8 = (ulong)uVar10;
        pRVar3 = (p_Cur->strm).curdata;
        pRVar1 = pRVar3 + uVar8;
        (p_Cur->strm).curdata = pRVar1;
        (p_Cur->strm).nalu_offset = (p_Cur->strm).nalu_offset + uVar10;
        *(long *)((long)pvVar2 + 0x20) = *(long *)((long)pvVar2 + 0x20) - uVar8;
        p_Inp->in_length = p_Inp->in_length - uVar8;
        (p_Cur->strm).nalu_buf = pRVar1;
        (p_Cur->strm).nalu_type = pRVar3[uVar8] & 0x1f;
        (p_Cur->strm).startcode_found = '\0';
        (p_Cur->strm).endcode_found = '\x01';
        MVar6 = store_cur_nalu(p_Cur,p_strm,phVar4->dxva_ctx);
        if (MVar6 < MPP_OK) {
          if (((byte)h264d_debug & 4) == 0) goto LAB_0018c81e;
          fmt = "Function error(%d).\n";
          uVar11 = 0x3ad;
          goto LAB_0018c817;
        }
        uVar10 = (p_Cur->strm).nalu_len;
        uVar9 = (ulong)uVar10;
        puVar7 = (uint *)((p_Cur->strm).curdata + uVar9);
        (p_Cur->strm).curdata = (RK_U8 *)puVar7;
        (p_Cur->strm).nalu_offset = (p_Cur->strm).nalu_offset + uVar10;
        *(long *)((long)pvVar2 + 0x20) = *(long *)((long)pvVar2 + 0x20) - uVar9;
        uVar9 = p_Inp->in_length - uVar9;
        p_Inp->in_length = uVar9;
        (p_Cur->strm).startcode_found = '\x01';
        (p_Cur->strm).endcode_found = '\0';
        (p_Cur->strm).nalu_len = 0;
        uVar8 = (ulong)p_Inp->nal_size;
      }
    } while (uVar8 <= uVar9);
    phVar4 = p_Cur->p_Dec;
    phVar4->have_slice_data = '\0';
    phVar4->is_new_frame = '\x01';
    *(undefined8 *)((long)pvVar2 + 0x20) = 0;
    p_Inp->in_length = 0;
    (p_Cur->strm).nalu_len = 0;
    (p_Cur->strm).nalu_offset = 0;
    (p_Cur->strm).startcode_found = '\x01';
    (p_Cur->strm).endcode_found = '\0';
    (p_Cur->strm).nalu_buf = (RK_U8 *)0x0;
LAB_0018c766:
    if ((p_Cur->strm).tmp_offset != 0) {
      clear_extra_header(p_strm);
    }
    MVar6 = add_empty_nalu(p_strm);
    if (MPP_NOK < MVar6) {
      (p_Cur->strm).head_offset = 0;
      (p_Cur->strm).first_mb_in_slice = 0;
      p_Cur->p_Inp->task_valid = '\x01';
      p_Cur->p_Dec->is_new_frame = '\0';
      RVar5 = p_Inp->in_dts;
      p_Cur->last_pts = p_Inp->in_pts;
      p_Cur->last_dts = RVar5;
LAB_0018c7b6:
      (p_Cur->strm).nalu_buf = (RK_U8 *)0x0;
      MVar6 = MPP_OK;
      goto LAB_0018c81e;
    }
    if (((byte)h264d_debug & 4) == 0) goto LAB_0018c81e;
    fmt = "Function error(%d).\n";
    uVar11 = 0x3c9;
  }
LAB_0018c817:
  _mpp_log_l(4,"h264d_parse",fmt,(char *)0x0,uVar11);
LAB_0018c81e:
  RVar5 = p_Inp->in_dts;
  p_Cur->last_pts = p_Inp->in_pts;
  p_Cur->last_dts = RVar5;
  p_Inp->p_Dec->nalu_ret = HaveNoStream;
  return MVar6;
}

Assistant:

MPP_RET parse_prepare_avcC_data(H264dInputCtx_t *p_Inp, H264dCurCtx_t *p_Cur)
{
    MPP_RET ret = MPP_ERR_UNKNOW;

    H264dCurStream_t *p_strm = &p_Cur->strm;
    MppPacketImpl *pkt_impl  = (MppPacketImpl *)p_Inp->in_pkt;

    p_strm->nalu_buf = NULL;
    p_Inp->task_valid = 0;
    if (p_Inp->pkt_eos) {
        p_Inp->task_eos = 1;
        if (p_Inp->in_length)
            p_Inp->task_valid = 1;
        return MPP_OK;
    }
    VAL_CHECK(ret, (p_Inp->nal_size > 0));
    p_strm->curdata = &p_Inp->in_buf[p_strm->nalu_offset];
    while (p_Inp->in_length > 0) {
        if (p_strm->startcode_found) {
            p_strm->nalu_len = parse_nal_size(p_Inp->nal_size, p_strm->curdata);
            if (p_strm->nalu_len <= 0 ||  p_strm->nalu_len >= p_Inp->in_length) {
                p_Cur->p_Dec->is_new_frame = 1;
                p_Cur->p_Dec->have_slice_data = 0;
                pkt_impl->length = 0;
                p_Inp->in_length = 0;
                p_strm->nalu_len = 0;
                p_strm->nalu_offset = 0;
                p_strm->startcode_found = 1;
                p_strm->endcode_found = 0;
                p_strm->nalu_buf  = NULL;
                goto __FAILED;
            }

            p_strm->nalu_buf = p_strm->curdata + p_Inp->nal_size;
            judge_is_new_frame(p_Cur, p_strm);
            if (p_Cur->p_Dec->is_new_frame) {
                p_Cur->p_Dec->have_slice_data = 0;
                p_strm->startcode_found = 1;
                p_strm->endcode_found = 0;
                break;
            }

            p_strm->curdata += p_Inp->nal_size;
            p_strm->nalu_offset += p_Inp->nal_size;
            pkt_impl->length -= p_Inp->nal_size;
            p_Inp->in_length -= p_Inp->nal_size;

            p_strm->nalu_buf = p_strm->curdata;
            p_strm->nalu_type = p_strm->nalu_buf[0] & 0x1F;
            p_strm->startcode_found = 0;
            p_strm->endcode_found = 1;

            FUN_CHECK(ret = store_cur_nalu(p_Cur, p_strm, p_Cur->p_Dec->dxva_ctx));
            p_strm->curdata += p_strm->nalu_len;
            p_strm->nalu_offset += p_strm->nalu_len;
            pkt_impl->length -= p_strm->nalu_len;
            p_Inp->in_length -= p_strm->nalu_len;
            p_strm->startcode_found = 1;
            p_strm->endcode_found = 0;
            p_strm->nalu_len = 0;
        }

        if (p_Inp->in_length < p_Inp->nal_size) {
            p_Cur->p_Dec->is_new_frame = 1;
            p_Cur->p_Dec->have_slice_data = 0;
            pkt_impl->length = 0;
            p_Inp->in_length = 0;
            p_strm->nalu_len = 0;
            p_strm->nalu_offset = 0;
            p_strm->startcode_found = 1;
            p_strm->endcode_found = 0;
            p_strm->nalu_buf  = NULL;
            break;
        }
    }
    //!< one frame end
    if (p_Cur->p_Dec->is_new_frame) {
        if (p_strm->tmp_offset)
            clear_extra_header(p_strm);
        //!< add an empty nalu to tell frame end
        FUN_CHECK(ret = add_empty_nalu(p_strm));
        //!< reset curstream parameters
        p_strm->head_offset = 0;
        p_strm->first_mb_in_slice = 0;
        p_Cur->p_Inp->task_valid = 1;
        p_Cur->p_Dec->is_new_frame = 0;

        p_Cur->last_dts = p_Inp->in_dts;
        p_Cur->last_pts = p_Inp->in_pts;
    }
    p_strm->nalu_buf = NULL;
    ret = MPP_OK;
__FAILED:
    //p_strm->nalu_len = 0;
    p_Cur->last_dts  = p_Inp->in_dts;
    p_Cur->last_pts  = p_Inp->in_pts;
    p_Inp->p_Dec->nalu_ret = HaveNoStream;

    return ret;
}